

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::character_either::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,character_either *this,location *param_1)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte *pbVar1;
  ulong uVar2;
  pointer puVar4;
  int c;
  int c_00;
  int c_01;
  int c_02;
  string *this_01;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pointer puVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = &this->chars_;
  puVar4 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar3 - (long)puVar4 == 1) {
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,0);
    show_char_abi_cxx11_(&local_b0,(detail *)(ulong)*pbVar1,c_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_b0);
    this_01 = &local_b0;
  }
  else {
    if ((long)puVar3 - (long)puVar4 != 2) {
      __n = 0;
      while (uVar2 = (long)puVar3 - (long)puVar4, __n < uVar2) {
        if (__n != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,", ");
          uVar2 = (long)(this->chars_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->chars_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        if (__n + 1 == uVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"or ");
        }
        pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,__n);
        show_char_abi_cxx11_(&local_b0,(detail *)(ulong)*pbVar1,c_02);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        puVar4 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        __n = __n + 1;
        puVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      return __return_storage_ptr__;
    }
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,0);
    show_char_abi_cxx11_(&local_70,(detail *)(ulong)*pbVar1,c);
    std::operator+(&local_50,&local_70," or ");
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,1);
    show_char_abi_cxx11_(&local_90,(detail *)(ulong)*pbVar1,c_00);
    std::operator+(&local_b0,&local_50,&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    this_01 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_either::expected_chars(location&) const
{
    assert( ! chars_.empty());

    std::string expected;
    if(chars_.size() == 1)
    {
        expected += show_char(chars_.at(0));
    }
    else if(chars_.size() == 2)
    {
        expected += show_char(chars_.at(0)) + " or " + show_char(chars_.at(1));
    }
    else
    {
        for(std::size_t i=0; i<chars_.size(); ++i)
        {
            if(i != 0)
            {
                expected += ", ";
            }
            if(i + 1 == chars_.size())
            {
                expected += "or ";
            }
            expected += show_char(chars_.at(i));
        }
    }
    return expected;
}